

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O2

void __thiscall
shift_window_transformer::SwinTransformer<float>::SwinTransformer
          (SwinTransformer<float> *this,array<int,_4UL> *layers,array<int,_4UL> *heads,int hiddenDim
          ,int inputChannels,int numClasses,int headDim,int windowSize,
          array<int,_4UL> *downscalingFactors,bool relativePosEmbedding)

{
  int hidden_dimension;
  
  *(undefined ***)this = &PTR_forward_0010b988;
  StageModule<float>::StageModule
            (&this->stage1,inputChannels,hiddenDim,layers->_M_elems[0],
             downscalingFactors->_M_elems[0],heads->_M_elems[0],headDim,windowSize,
             relativePosEmbedding);
  StageModule<float>::StageModule
            (&this->stage2,hiddenDim,hiddenDim * 2,layers->_M_elems[1],
             downscalingFactors->_M_elems[1],heads->_M_elems[1],headDim,windowSize,
             relativePosEmbedding);
  StageModule<float>::StageModule
            (&this->stage3,hiddenDim * 2,hiddenDim * 4,layers->_M_elems[2],
             downscalingFactors->_M_elems[2],heads->_M_elems[2],headDim,windowSize,
             relativePosEmbedding);
  hidden_dimension = hiddenDim << 3;
  StageModule<float>::StageModule
            (&this->stage4,hiddenDim * 4,hidden_dimension,layers->_M_elems[3],
             downscalingFactors->_M_elems[3],heads->_M_elems[3],headDim,windowSize,
             relativePosEmbedding);
  *(undefined ***)&this->layerNorm = &PTR_forward_0010bd80;
  (this->layerNorm).dim = hidden_dimension;
  (this->layerNorm).eps = 1e-05;
  (this->layerNorm).beta = 1.0;
  (this->layerNorm).gamma = 1.0;
  Linear<float>::Linear(&this->linear,hidden_dimension,numClasses);
  return;
}

Assistant:

SwinTransformer(const std::array<int, 4> &layers, const std::array<int, 4> &heads, int hiddenDim,
                        int inputChannels,
                        int numClasses, int headDim, int windowSize, const std::array<int, 4> &downscalingFactors,
                        bool relativePosEmbedding) :
                stage1(inputChannels, hiddenDim, layers[0], downscalingFactors[0], heads[0], headDim,
                       windowSize, relativePosEmbedding),
                stage2(hiddenDim, hiddenDim * 2, layers[1], downscalingFactors[1], heads[1], headDim,
                       windowSize, relativePosEmbedding),
                stage3(hiddenDim * 2, hiddenDim * 4, layers[2], downscalingFactors[2], heads[2], headDim,
                       windowSize, relativePosEmbedding),
                stage4(hiddenDim * 4, hiddenDim * 8, layers[3], downscalingFactors[3], heads[3], headDim,
                       windowSize, relativePosEmbedding),
                layerNorm(hiddenDim * 8),
                linear(hiddenDim * 8, numClasses) {
        }